

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O2

void writeRgbaWithPreview2(char *fileName,int width,int height)

{
  Rgba *pRVar1;
  PreviewRgba *pPVar2;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  RgbaOutputFile file;
  half hStack_be;
  half hStack_bc;
  half hStack_ba;
  Array<Imf_3_2::Rgba> pixels;
  Array2D<Imf_3_2::PreviewRgba> previewPixels;
  Header header;
  
  Imf_3_2::Array<Imf_3_2::Rgba>::Array(&pixels,(long)width);
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::Array2D
            (&previewPixels,(long)(height / 8),(long)(width / 8));
  _file = 0;
  hStack_be._h = 0;
  hStack_bc._h = 0;
  hStack_ba._h = 0;
  Imf_3_2::Header::Header(&header,width,height,&file,0,3);
  Imf_3_2::PreviewImage::PreviewImage((PreviewImage *)&file,width / 8,height / 8,(PreviewRgba *)0x0)
  ;
  Imf_3_2::Header::setPreviewImage((PreviewImage *)&header);
  Imf_3_2::PreviewImage::~PreviewImage((PreviewImage *)&file);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile(&file,fileName,&header,WRITE_RGBA,iVar3);
  uVar7 = 0;
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&file,(ulong)pixels._data,1);
  iVar3 = 0;
  if (0 < height) {
    iVar3 = height;
  }
  for (; (int)uVar7 != iVar3; uVar7 = uVar7 + 1) {
    drawImage7(&pixels,width,height,(int)uVar7);
    Imf_3_2::RgbaOutputFile::writePixels((int)&file);
    if ((uVar7 & 7) == 0) {
      lVar4 = 3;
      for (lVar6 = 0; pPVar2 = previewPixels._data, pRVar1 = pixels._data, lVar6 < width;
          lVar6 = lVar6 + 8) {
        lVar5 = previewPixels._sizeY * (uVar7 >> 3) * 4;
        gamma((double)(ulong)*(uint *)(_imath_half_to_float_table +
                                      (ulong)pixels._data[lVar6].r._h * 4));
        *(undefined1 *)((long)pPVar2 + lVar4 + -3 + lVar5) = extraout_AL;
        gamma((double)(ulong)*(uint *)(_imath_half_to_float_table + (ulong)pRVar1[lVar6].g._h * 4));
        *(undefined1 *)((long)pPVar2 + lVar4 + -2 + lVar5) = extraout_AL_00;
        gamma((double)(ulong)*(uint *)(_imath_half_to_float_table + (ulong)pRVar1[lVar6].b._h * 4));
        *(undefined1 *)((long)pPVar2 + lVar4 + -1 + lVar5) = extraout_AL_01;
        fVar8 = *(float *)(_imath_half_to_float_table + (ulong)pRVar1[lVar6].a._h * 4) * 255.0;
        fVar9 = 255.0;
        if (fVar8 <= 255.0) {
          fVar9 = fVar8;
        }
        (&pPVar2->r)[lVar4 + lVar5] =
             (uchar)(int)(float)(-(uint)(fVar8 < 0.0) & 0x3f000000 |
                                ~-(uint)(fVar8 < 0.0) & (uint)(fVar9 + 0.5));
        lVar4 = lVar4 + 4;
      }
    }
  }
  Imf_3_2::RgbaOutputFile::updatePreviewImage((PreviewRgba *)&file);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&file);
  Imf_3_2::Header::~Header(&header);
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::~Array2D(&previewPixels);
  Imf_3_2::Array<Imf_3_2::Rgba>::~Array(&pixels);
  return;
}

Assistant:

void
writeRgbaWithPreview2 (const char fileName[], int width, int height)
{
    //
    // Write an image file with a preview image, version 2:
    //
    // - generate a file header
    // - add a dummy preview image to the file header
    // - open the file (this stores the header with the dummy
    //   preview image in the file)
    // - render the main image's pixels one scan line at a time,
    //   and store each scan line in the file before rendering
    //   the next scan line
    // - generate the preview image on the fly, while the main
    //   image is being rendered
    // - once the main image has been rendered, store the preview
    //   image in the file, overwriting the dummy preview
    //

    Array<Rgba> pixels (width);

    const int N = 8;

    int                  previewWidth  = width / N;
    int                  previewHeight = height / N;
    Array2D<PreviewRgba> previewPixels (previewHeight, previewWidth);

    Header header (width, height);
    header.setPreviewImage (PreviewImage (previewWidth, previewHeight));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, 0);

    for (int y = 0; y < height; ++y)
    {
        drawImage7 (pixels, width, height, y);
        file.writePixels (1);

        if (y % N == 0)
        {
            for (int x = 0; x < width; x += N)
            {
                const Rgba&  inPixel  = pixels[x];
                PreviewRgba& outPixel = previewPixels[y / N][x / N];

                outPixel.r = gamma (inPixel.r);
                outPixel.g = gamma (inPixel.g);
                outPixel.b = gamma (inPixel.b);
                outPixel.a = int (
                    IMATH_NAMESPACE::clamp (inPixel.a * 255.f, 0.f, 255.f) +
                    0.5f);
            }
        }
    }

    file.updatePreviewImage (&previewPixels[0][0]);
}